

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall
kj::VectorOutputStream::VectorOutputStream(VectorOutputStream *this,size_t initialCapacity)

{
  uchar *puVar1;
  size_t initialCapacity_local;
  VectorOutputStream *this_local;
  
  BufferedOutputStream::BufferedOutputStream(&this->super_BufferedOutputStream);
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__VectorOutputStream_00c13f48;
  heapArray<unsigned_char>(&this->vector,initialCapacity);
  puVar1 = Array<unsigned_char>::begin(&this->vector);
  this->fillPos = puVar1;
  return;
}

Assistant:

VectorOutputStream::VectorOutputStream(size_t initialCapacity)
    : vector(heapArray<byte>(initialCapacity)), fillPos(vector.begin()) {}